

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O0

void __thiscall OpenMD::UniformGradient::UniformGradient(UniformGradient *this,SimInfo *info)

{
  Globals *pGVar1;
  SimInfo *in_RSI;
  ForceModifier *in_RDI;
  
  ForceModifier::ForceModifier(in_RDI,in_RSI);
  in_RDI->_vptr_ForceModifier = (_func_int **)&PTR__UniformGradient_00500e18;
  *(undefined1 *)&in_RDI[1]._vptr_ForceModifier = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 2) = 0;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x369e0b);
  Vector3<double>::Vector3((Vector3<double> *)0x369e1b);
  Vector3<double>::Vector3((Vector3<double> *)0x369e2b);
  in_RDI[9].info_ = (SimInfo *)0x0;
  in_RDI[10]._vptr_ForceModifier = (_func_int **)0x0;
  pGVar1 = SimInfo::getSimParams(in_RDI->info_);
  in_RDI[1].info_ = (SimInfo *)pGVar1;
  return;
}

Assistant:

UniformGradient::UniformGradient(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doUniformGradient {false},
      doParticlePot {false} {
    simParams = info_->getSimParams();
  }